

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test::TestBody
          (cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *str_buffer;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *blind_handle;
  int64_t satoshi;
  char *tx_string;
  AssertionResult gtest_ar_;
  char *in_stack_000002a8;
  uint32_t in_stack_000002b4;
  char *in_stack_000002b8;
  void *in_stack_000002c0;
  void *in_stack_000002c8;
  AssertionResult gtest_ar;
  int ret;
  char *in_stack_000002e0;
  void *handle;
  char *in_stack_000002f8;
  char **in_stack_000004c0;
  char *in_stack_000004c8;
  void *in_stack_000004d0;
  void *in_stack_000004d8;
  bool *in_stack_fffffffffffffd08;
  AssertionResult *in_stack_fffffffffffffd10;
  CfdErrorCode *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  void **in_stack_fffffffffffffd28;
  void *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd90;
  AssertionResult *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  char *in_stack_fffffffffffffda8;
  void **in_stack_fffffffffffffde0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  char *local_178;
  AssertHelper local_170;
  Message local_168;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  AssertHelper local_100;
  Message local_f8;
  undefined4 local_ec;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  long local_b0;
  undefined8 local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffd28);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x347bca);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x423,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x347c2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x347c82);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(type *)0x347cb6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x424,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x347db2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x347e2d);
  local_a0 = (char *)0x0;
  local_b0 = 0;
  local_14 = CfdInitializeBlindTx
                       ((void *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                        in_stack_fffffffffffffde0);
  local_c4 = 0;
  this_00 = &local_c0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x347f0e);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x42c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x347f71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x347fc9);
  if (local_14 == 0) {
    local_a8 = 1000000;
    in_stack_fffffffffffffd10 = (AssertionResult *)0xf4240;
    in_stack_fffffffffffffd20 = (char *)0x0;
    in_stack_fffffffffffffd18 = (CfdErrorCode *)0x0;
    local_14 = CfdAddBlindTxInData(in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
                                   in_stack_000002b4,in_stack_000002a8,
                                   (char *)gtest_ar_.message_.ptr_,in_stack_000002e0,(int64_t)handle
                                   ,(char *)this,in_stack_000002f8);
    local_ec = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
               ,(int *)in_stack_fffffffffffffd10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3480ec);
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x437,pcVar2);
      testing::internal::AssertHelper::operator=(&local_100,&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      testing::Message::~Message((Message *)0x34814f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3481a4);
  }
  if (local_14 == 0) {
    local_a8 = 10000;
    in_stack_fffffffffffffd10 = (AssertionResult *)0x2710;
    in_stack_fffffffffffffd20 = (char *)0x0;
    in_stack_fffffffffffffd18 = (CfdErrorCode *)0x0;
    local_14 = CfdAddBlindTxInData(in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
                                   in_stack_000002b4,in_stack_000002a8,
                                   (char *)gtest_ar_.message_.ptr_,in_stack_000002e0,(int64_t)handle
                                   ,(char *)this,in_stack_000002f8);
    local_114 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
               ,(int *)in_stack_fffffffffffffd10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      in_stack_fffffffffffffda8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3482cc);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x443,in_stack_fffffffffffffda8);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x34832f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x348384);
  }
  if (local_14 == 0) {
    local_14 = CfdFinalizeBlindTx(in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,
                                  in_stack_000004c0);
    local_13c = 0;
    in_stack_fffffffffffffd98 = &local_138;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
               ,(int *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffda7 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd98);
    if (!(bool)in_stack_fffffffffffffda7) {
      testing::Message::Message(&local_148);
      in_stack_fffffffffffffd90 =
           testing::AssertionResult::failure_message((AssertionResult *)0x34846c);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x448,in_stack_fffffffffffffd90);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x3484cf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x348524);
    testing::internal::CmpHelperSTRNE
              ((internal *)&local_160,"base_tx","tx_string",TestBody::base_tx,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3485bf);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x449,pcVar2);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x34861c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x348671);
  }
  if (local_b0 != 0) {
    CfdFreeBlindHandle(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  }
  CfdFreeStringBuffer((char *)in_stack_fffffffffffffd18);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffd48);
  if (local_14 != 0) {
    local_178 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffffda8,
                          (char **)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    local_18c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
               ,(int *)in_stack_fffffffffffffd10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34878b);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x456,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message((Message *)0x3487e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34883d);
    testing::internal::CmpHelperSTREQ((internal *)&local_1b0,"\"\"","str_buffer","",local_178);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3488d2);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x457,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message((Message *)0x34892f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x348984);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd18);
    local_178 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffd18);
  local_1d4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x348a54);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x45d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message((Message *)0x348ab1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x348b06);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, BlindDestroyAmountTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* base_tx = "0200000000020fd1d25bb34f2fb499304dec92571f88f553891aceda376533fb8d76fc64b0ea0000000000ffffffffd2b787c00072aa8a46bf77d04017cfc73665fc2a3945af0ac43ef2ed2eca1e4a0100000000ffffffff0301c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d20100000000000f424000016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000001c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d201000000000000000003edd71a5d0cd1e82e48ec3e26bfbfecb053b2a196e3ce56752312cc81e7eaca72016a00000000";

  char* tx_string = nullptr;
  int64_t satoshi;
  void* blind_handle = nullptr;
  ret = CfdInitializeBlindTx(handle, &blind_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    satoshi = 1000000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "eab064fc768dfb336537dace1a8953f5881f5792ec4d3099b42f4fb35bd2d10f", 0,
        "d209585084f73d815926859c8f234dff59615344045d212a93c7d080093dbdc7",
        "44c2852117c44c7a43833d5a681f09ec6120d889bb70891627d30a122ff24047",
        "3a2916b1ddd3514b32c533116e02b1262fc9df455df55d82a30197f4a81e9580",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 10000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "4a1eca2eedf23ec40aaf45392afc6536c7cf1740d077bf468aaa7200c087b7d2", 1,
        "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
        "7afdad5199ae3427783bca4e392ece8525431ec3345d08e231de7fa6bd4938ab",
        "32633edc9ed7acc9407935db0820921abdc446a7c0c0203d279740fc0b26425b",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeBlindTx(handle, blind_handle, base_tx, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STRNE(base_tx, tx_string);
  }

  if (blind_handle != nullptr) {
    CfdFreeBlindHandle(handle, blind_handle);
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}